

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

TRef snap_pref(jit_State *J,GCtrace *T,SnapEntry *map,MSize nmax,BloomFilter seen,IRRef ref)

{
  TRef TVar1;
  jit_State *J_00;
  MSize in_ECX;
  SnapEntry *in_RDX;
  long in_RSI;
  jit_State *in_RDI;
  ulong in_R8;
  uint in_R9D;
  TRef tr;
  IRIns *ir;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  J_00 = (jit_State *)(*(long *)(in_RSI + 0x10) + (ulong)in_R9D * 8);
  if (in_R9D < 0x8000) {
    TVar1 = snap_replay_const(J_00,(IRIns *)CONCAT44(in_stack_ffffffffffffffb4,
                                                     in_stack_ffffffffffffffb0));
  }
  else if (((J_00->cur).nsnap & 0xff80) == 0x80) {
    TVar1 = 0;
  }
  else if (((in_R8 & 1L << ((byte)in_R9D & 0x3f)) == 0) ||
          (TVar1 = snap_dedup(in_RDI,in_RDX,in_ECX,in_R9D), TVar1 == 0)) {
    (in_RDI->fold).ins.field_0.ot = (J_00->cur).marked & 0x1f | 0xe00;
    (in_RDI->fold).ins.field_0.op1 = (short)in_R9D + 0x8000;
    (in_RDI->fold).ins.field_0.op2 = 0;
    TVar1 = lj_opt_fold(J_00);
  }
  return TVar1;
}

Assistant:

static TRef snap_pref(jit_State *J, GCtrace *T, SnapEntry *map, MSize nmax,
		      BloomFilter seen, IRRef ref)
{
  IRIns *ir = &T->ir[ref];
  TRef tr;
  if (irref_isk(ref))
    tr = snap_replay_const(J, ir);
  else if (!regsp_used(ir->prev))
    tr = 0;
  else if (!bloomtest(seen, ref) || (tr = snap_dedup(J, map, nmax, ref)) == 0)
    tr = emitir(IRT(IR_PVAL, irt_type(ir->t)), ref - REF_BIAS, 0);
  return tr;
}